

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snapshot_sync_ctx.cxx
# Opt level: O1

bool __thiscall
nuraft::snapshot_io_mgr::push
          (snapshot_io_mgr *this,ptr<raft_server> *r,ptr<peer> *p,
          function<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>
          *h)

{
  bool bVar1;
  undefined1 local_59;
  ptr<io_queue_elem> elem;
  undefined1 local_48 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  
  peer::get_snapshot_sync_ctx((peer *)(local_48 + 0x10));
  peer::get_snapshot_sync_ctx((peer *)local_48);
  elem.super___shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<nuraft::snapshot_io_mgr::io_queue_elem,std::allocator<nuraft::snapshot_io_mgr::io_queue_elem>,std::shared_ptr<nuraft::raft_server>&,std::shared_ptr<nuraft::snapshot>const&,std::shared_ptr<nuraft::snapshot_sync_ctx>,std::shared_ptr<nuraft::peer>&,std::function<void(std::shared_ptr<nuraft::resp_msg>&,std::shared_ptr<nuraft::rpc_exception>&)>&>
            (&elem.
              super___shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,(io_queue_elem **)&elem,
             (allocator<nuraft::snapshot_io_mgr::io_queue_elem> *)&local_59,r,
             (shared_ptr<nuraft::snapshot> *)(local_48._16_8_ + 8),
             (shared_ptr<nuraft::snapshot_sync_ctx> *)local_48,p,h);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_);
  }
  if (local_30._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30._M_pi);
  }
  bVar1 = push(this,&elem);
  if (elem.super___shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (elem.
               super___shared_ptr<nuraft::snapshot_io_mgr::io_queue_elem,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return bVar1;
}

Assistant:

bool snapshot_io_mgr::push(ptr<raft_server> r,
                           ptr<peer> p,
                           std::function< void(ptr<resp_msg>&, ptr<rpc_exception>&) >& h)
{
    ptr<io_queue_elem> elem =
        cs_new<io_queue_elem>( r,
                               p->get_snapshot_sync_ctx()->get_snapshot(),
                               p->get_snapshot_sync_ctx(),
                               p,
                               h );
    return push(elem);
}